

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

void __thiscall
cmArchiveWrite::cmArchiveWrite(cmArchiveWrite *this,ostream *os,Compress c,string *format)

{
  string *this_00;
  pointer pcVar1;
  int iVar2;
  archive *paVar3;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  this->Stream = os;
  paVar3 = archive_write_new();
  this->Archive = paVar3;
  paVar3 = archive_read_disk_new();
  this->Disk = paVar3;
  this->Verbose = false;
  local_38 = &this->Format;
  local_40 = &(this->Format).field_2;
  (this->Format)._M_dataplus._M_p = (pointer)local_40;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + format->_M_string_length);
  this_00 = &this->Error;
  local_48 = &(this->Error).field_2;
  (this->Error)._M_dataplus._M_p = (pointer)local_48;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  local_50 = &(this->MTime).field_2;
  (this->MTime)._M_dataplus._M_p = (pointer)local_50;
  (this->MTime)._M_string_length = 0;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  (this->Uid).IsValueSet = false;
  (this->Gid).IsValueSet = false;
  local_58 = &(this->Uname).field_2;
  (this->Uname)._M_dataplus._M_p = (pointer)local_58;
  (this->Uname)._M_string_length = 0;
  (this->Uname).field_2._M_local_buf[0] = '\0';
  (this->Gname)._M_dataplus._M_p = (pointer)&(this->Gname).field_2;
  (this->Gname)._M_string_length = 0;
  (this->Gname).field_2._M_local_buf[0] = '\0';
  (this->Permissions).IsValueSet = false;
  (this->PermissionsMask).IsValueSet = false;
  switch(c) {
  case CompressNone:
    iVar2 = archive_write_add_filter_none(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x57880c);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      goto LAB_00376ab7;
    }
    break;
  case CompressCompress:
    iVar2 = archive_write_add_filter_compress(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x57882c);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      goto LAB_00376ab7;
    }
    break;
  case CompressGZip:
    iVar2 = archive_write_add_filter_gzip(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x578850);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      goto LAB_00376ab7;
    }
    break;
  case CompressBZip2:
    iVar2 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x578870);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      goto LAB_00376ab7;
    }
    break;
  case CompressLZMA:
    iVar2 = archive_write_add_filter_lzma(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x578891);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      goto LAB_00376ab7;
    }
    break;
  case CompressXZ:
    iVar2 = archive_write_add_filter_xz(this->Archive);
    if (iVar2 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x5788b1);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      goto LAB_00376ab7;
    }
  }
  iVar2 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar2 == 0) {
    iVar2 = archive_write_set_format_by_name(this->Archive,(format->_M_dataplus)._M_p);
    if (iVar2 == 0) {
      iVar2 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar2 == 0) {
        iVar2 = archive_write_open(this->Archive,this,(undefined1 *)0x0,Callback::Write,
                                   (undefined1 *)0x0);
        if (iVar2 == 0) {
          return;
        }
        std::__cxx11::string::operator=((string *)this_00,"archive_write_open: ");
        cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
        std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x57891a);
        cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
        std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x5788f7);
      cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this->Error)._M_string_length,0x5788cf);
    cm_archive_error_string_abi_cxx11_(&local_78,this->Archive);
    std::__cxx11::string::_M_append((char *)this_00,(ulong)local_78._M_dataplus._M_p);
  }
LAB_00376ab7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Verbose(false)
  , Format(format)
{
  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_none: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_compress: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressGZip:
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_gzip: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_bzip2: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_lzma: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = "archive_write_add_filter_xz: ";
        this->Error += cm_archive_error_string(this->Archive);
        return;
      }
      break;
  };
#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = "archive_read_disk_set_standard_lookup: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = "archive_write_set_format_by_name: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = "archive_write_set_bytes_in_last_block: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }

  if (archive_write_open(
        this->Archive, this, CM_NULLPTR,
        reinterpret_cast<archive_write_callback*>(&Callback::Write),
        CM_NULLPTR) != ARCHIVE_OK) {
    this->Error = "archive_write_open: ";
    this->Error += cm_archive_error_string(this->Archive);
    return;
  }
}